

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O0

void __thiscall
toml::
success<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
::~success(success<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
           *this)

{
  success<std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>_>
  *this_local;
  
  std::pair<toml::string,_toml::detail::region<std::vector<char,_std::allocator<char>_>_>_>::~pair
            (&this->value);
  return;
}

Assistant:

~success() = default;